

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::
SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
::Sweep(SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
        *this,RecyclerSweep *recyclerSweep)

{
  undefined4 *puVar1;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 *in_FS_OFFSET;
  anon_class_16_2_19447d9f sweepFn;
  
  bVar4 = RecyclerSweep::IsBackground(recyclerSweep);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBucket.cpp"
                       ,100,"(!recyclerSweep.IsBackground())","!recyclerSweep.IsBackground()");
    if (!bVar4) goto LAB_002ac6b4;
    *puVar1 = 0;
  }
  if (this->tempPendingDisposeList !=
      (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBucket.cpp"
                       ,0x67,"(this->tempPendingDisposeList == nullptr)",
                       "this->tempPendingDisposeList == nullptr");
    if (!bVar4) {
LAB_002ac6b4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  pSVar2 = this->pendingDisposeList;
  this->tempPendingDisposeList = pSVar2;
  this->pendingDisposeList = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  sweepFn.currentDisposeList = pSVar2;
  sweepFn.this = this;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::
  SweepBucket<Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::Sweep(Memory::RecyclerSweep&)::_lambda(Memory::RecyclerSweep&)_1_>
            ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>> *)this
             ,recyclerSweep,sweepFn);
  return;
}

Assistant:

void
SmallFinalizableHeapBucketBaseT<TBlockType>::Sweep(RecyclerSweep& recyclerSweep)
{
    Assert(!recyclerSweep.IsBackground());

#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
    Assert(this->tempPendingDisposeList == nullptr);
    this->tempPendingDisposeList = pendingDisposeList;
#endif

    TBlockType * currentDisposeList = pendingDisposeList;
    this->pendingDisposeList = nullptr;

    BaseT::SweepBucket(recyclerSweep, [=](RecyclerSweep& recyclerSweep)
    {
#if DBG
        if (TBlockType::HeapBlockAttributes::IsSmallBlock)
        {
            recyclerSweep.SetupVerifyListConsistencyDataForSmallBlock(nullptr, false, true);
        }
        else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
        {
            recyclerSweep.SetupVerifyListConsistencyDataForMediumBlock(nullptr, false, true);
        }
        else
        {
            Assert(false);
        }
#endif

        HeapBucketT<TBlockType>::SweepHeapBlockList(recyclerSweep, currentDisposeList, false);

#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
        Assert(this->tempPendingDisposeList == currentDisposeList);
        this->tempPendingDisposeList = nullptr;
#endif
        RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));
    });

}